

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.h
# Opt level: O0

bool __thiscall S2Polygon::OwningShape::Init(OwningShape *this,Decoder *decoder)

{
  bool bVar1;
  pointer pSVar2;
  unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_> local_28;
  scalar polygon;
  Decoder *decoder_local;
  OwningShape *this_local;
  
  polygon._M_t.super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
  super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
  super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl =
       (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)
       (__uniq_ptr_data<S2Polygon,_std::default_delete<S2Polygon>,_true,_true>)decoder;
  absl::make_unique<S2Polygon>();
  pSVar2 = std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::operator->(&local_28);
  bVar1 = Decode(pSVar2,(Decoder *)
                        polygon._M_t.
                        super___uniq_ptr_impl<S2Polygon,_std::default_delete<S2Polygon>_>._M_t.
                        super__Tuple_impl<0UL,_S2Polygon_*,_std::default_delete<S2Polygon>_>.
                        super__Head_base<0UL,_S2Polygon_*,_false>._M_head_impl);
  if (bVar1) {
    pSVar2 = std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::get(&local_28);
    Shape::Init(&this->super_Shape,pSVar2);
    std::unique_ptr<S2Polygon_const,std::default_delete<S2Polygon_const>>::operator=
              ((unique_ptr<S2Polygon_const,std::default_delete<S2Polygon_const>> *)
               &this->owned_polygon_,&local_28);
  }
  std::unique_ptr<S2Polygon,_std::default_delete<S2Polygon>_>::~unique_ptr(&local_28);
  return bVar1;
}

Assistant:

bool Init(Decoder* decoder) {
      auto polygon = absl::make_unique<S2Polygon>();
      if (!polygon->Decode(decoder)) return false;
      Shape::Init(polygon.get());
      owned_polygon_ = std::move(polygon);
      return true;
    }